

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_deflate(lzham_z_streamp pStream,int flush)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  lzham_compress_status_t lVar6;
  uint32 uVar7;
  int in_ESI;
  long *in_RDI;
  lzham_compress_status_t status;
  lzham_compress_state *pState;
  lzham_compress_state_ptr pComp;
  size_t out_bytes;
  size_t in_bytes;
  lzham_z_ulong orig_total_out;
  lzham_z_ulong orig_total_in;
  int lzham_status;
  lzham_uint8 *in_stack_00000050;
  lzham_compress_state_ptr in_stack_00000058;
  int local_18;
  int local_14;
  int local_4;
  
  if ((((in_RDI == (long *)0x0) || (in_RDI[7] == 0)) || (in_ESI < 0)) ||
     ((4 < in_ESI || (in_RDI[3] == 0)))) {
    local_4 = -2;
  }
  else if ((int)in_RDI[4] == 0) {
    local_4 = -5;
  }
  else {
    local_14 = in_ESI;
    if (in_ESI == 1) {
      local_14 = 2;
    }
    local_18 = 0;
    lVar3 = in_RDI[2];
    lVar4 = in_RDI[5];
    do {
      uVar1 = *(uint *)(in_RDI + 1);
      uVar2 = *(uint *)(in_RDI + 4);
      lVar5 = in_RDI[7];
      lVar6 = lzham_lib_compress2(in_stack_00000058,in_stack_00000050,(size_t *)pStream,
                                  (lzham_uint8 *)CONCAT44(flush,lzham_status),
                                  (size_t *)orig_total_in,orig_total_out._4_4_);
      *in_RDI = *in_RDI + (ulong)uVar1;
      *(uint *)(in_RDI + 1) = (int)in_RDI[1] - uVar1;
      in_RDI[2] = (ulong)uVar1 + in_RDI[2];
      in_RDI[3] = in_RDI[3] + (ulong)uVar2;
      *(uint *)(in_RDI + 4) = (int)in_RDI[4] - uVar2;
      in_RDI[5] = (ulong)uVar2 + in_RDI[5];
      uVar7 = lzcompressor::get_src_adler32((lzcompressor *)(lVar5 + 0xa58));
      in_RDI[0xc] = (ulong)uVar7;
      if (LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE < lVar6) {
        local_18 = -2;
        goto LAB_0010dcf4;
      }
      if (lVar6 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        local_18 = 1;
        goto LAB_0010dcf4;
      }
      if ((int)in_RDI[4] == 0) goto LAB_0010dcf4;
    } while (((int)in_RDI[1] != 0) || (local_14 == 4));
    if ((local_14 == 0) && ((in_RDI[2] == lVar3 && (in_RDI[5] == lVar4)))) {
      local_4 = -5;
    }
    else {
LAB_0010dcf4:
      local_4 = local_18;
    }
  }
  return local_4;
}

Assistant:

int lzham_lib_z_deflate(lzham_z_streamp pStream, int flush)
   {
      if ((!pStream) || (!pStream->state) || (flush < 0) || (flush > LZHAM_Z_FINISH) || (!pStream->next_out))
      {
         LZHAM_LOG_ERROR(6037);
         return LZHAM_Z_STREAM_ERROR;
      }

      if (!pStream->avail_out)
      {
         LZHAM_LOG_ERROR(6038);
         return LZHAM_Z_BUF_ERROR;
      }

      if (flush == LZHAM_Z_PARTIAL_FLUSH)
         flush = LZHAM_Z_SYNC_FLUSH;

      int lzham_status = LZHAM_Z_OK;
      lzham_z_ulong orig_total_in = pStream->total_in, orig_total_out = pStream->total_out;
      for ( ; ; )
      {
         size_t in_bytes = pStream->avail_in, out_bytes = pStream->avail_out;

         lzham_compress_state_ptr pComp = (lzham_compress_state_ptr)pStream->state;
         lzham_compress_state *pState = static_cast<lzham_compress_state*>(pComp);

         lzham_compress_status_t status = lzham_lib_compress2(
            pComp,
            pStream->next_in, &in_bytes,
            pStream->next_out, &out_bytes,
            (lzham_flush_t)flush);

         pStream->next_in += (uint)in_bytes;
         pStream->avail_in -= (uint)in_bytes;
         pStream->total_in += (uint)in_bytes;

         pStream->next_out += (uint)out_bytes;
         pStream->avail_out -= (uint)out_bytes;
         pStream->total_out += (uint)out_bytes;

         pStream->adler = pState->m_compressor.get_src_adler32();

         if (status >= LZHAM_COMP_STATUS_FIRST_FAILURE_CODE)
         {
            lzham_status = LZHAM_Z_STREAM_ERROR;
            LZHAM_LOG_ERROR(6039);
            break;
         }
         else if (status == LZHAM_COMP_STATUS_SUCCESS)
         {
            lzham_status = LZHAM_Z_STREAM_END;
            break;
         }
         else if (!pStream->avail_out)
            break;
         else if ((!pStream->avail_in) && (flush != LZHAM_Z_FINISH))
         {
            if ((flush) || (pStream->total_in != orig_total_in) || (pStream->total_out != orig_total_out))
               break;
            LZHAM_LOG_ERROR(6040);
            return LZHAM_Z_BUF_ERROR; // Can't make forward progress without some input.
         }
      }
      return lzham_status;
   }